

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsortfilterproxymodel.cpp
# Opt level: O0

void __thiscall QSortFilterProxyModel::sort(QSortFilterProxyModel *this,int column,SortOrder order)

{
  parameter_type pVar1;
  QSortFilterProxyModelPrivate *pQVar2;
  SortOrder in_EDX;
  int in_ESI;
  QSortFilterProxyModelPrivate *d;
  QSortFilterProxyModelPrivate *in_stack_00000038;
  
  pQVar2 = d_func((QSortFilterProxyModel *)0x8787df);
  pVar1 = ::QObjectCompatProperty::operator_cast_to_bool
                    ((QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_dynamic_sortfilter_offset,_&QSortFilterProxyModelPrivate::setDynamicSortFilterForwarder,_nullptr,_nullptr>
                      *)0x8787f3);
  if (((!pVar1) || (pQVar2->proxy_sort_column != in_ESI)) || (pQVar2->sort_order != in_EDX)) {
    pQVar2->sort_order = in_EDX;
    pQVar2->proxy_sort_column = in_ESI;
    QSortFilterProxyModelPrivate::update_source_sort_column((QSortFilterProxyModelPrivate *)this);
    QSortFilterProxyModelPrivate::sort(in_stack_00000038);
  }
  return;
}

Assistant:

void QSortFilterProxyModel::sort(int column, Qt::SortOrder order)
{
    Q_D(QSortFilterProxyModel);
    if (d->dynamic_sortfilter && d->proxy_sort_column == column && d->sort_order == order)
        return;
    d->sort_order = order;
    d->proxy_sort_column = column;
    d->update_source_sort_column();
    d->sort();
}